

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O3

exr_result_t
hufDecode(uint64_t *hcode,HufDec *hdecod,uint8_t *in,uint64_t ni,uint32_t rlc,uint64_t no,
         uint16_t *out)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint16_t *puVar7;
  byte bVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  uint16_t *outb;
  
  puVar1 = out + no;
  pbVar14 = in + (ni + 7 >> 3);
  puVar7 = out;
  if (ni == 0) {
    iVar10 = 0;
    uVar15 = 0;
  }
  else {
    uVar15 = 0;
    iVar11 = 0;
    do {
      bVar8 = *in;
      in = in + 1;
      uVar15 = (ulong)bVar8 | uVar15 << 8;
      iVar10 = iVar11 + 8;
      iVar12 = iVar10;
      if (5 < iVar11) {
        do {
          uVar9 = (ulong)(((uint)(uVar15 >> ((char)iVar12 - 0xeU & 0x3f)) & 0x3fff) << 4);
          iVar11 = *(int *)((long)&hdecod->len + uVar9);
          if (iVar11 == 0) {
            lVar5 = *(long *)((long)&hdecod->p + uVar9);
            if (lVar5 == 0) {
              return 0x17;
            }
            uVar16 = *(uint *)((long)&hdecod->lit + uVar9);
            if ((ulong)uVar16 == 0) {
              uVar9 = 0;
              iVar10 = iVar12;
            }
            else {
              uVar9 = 0;
              while( true ) {
                uVar4 = *(uint *)(lVar5 + uVar9 * 4);
                uVar13 = hcode[uVar4];
                uVar6 = (uint)uVar13 & 0x3f;
                while( true ) {
                  if (((int)uVar6 <= iVar12) || (pbVar14 <= in)) break;
                  bVar8 = *in;
                  in = in + 1;
                  uVar15 = (ulong)bVar8 | uVar15 << 8;
                  iVar12 = iVar12 + 8;
                }
                if (((int)uVar6 <= iVar12) &&
                   (iVar10 = iVar12 - uVar6,
                   uVar13 >> 6 ==
                   (~(-1L << ((byte)uVar13 & 0x3f)) & uVar15 >> ((byte)iVar10 & 0x3f)))) break;
                uVar9 = uVar9 + 1;
                if (uVar9 == uVar16) {
                  return 0x17;
                }
              }
              if (uVar4 == rlc) {
                if (iVar10 < 8) {
                  if (pbVar14 <= in) {
                    return 1;
                  }
                  bVar8 = *in;
                  in = in + 1;
                  uVar15 = uVar15 << 8 | (ulong)bVar8;
                  iVar10 = iVar10 + 8;
                }
                iVar10 = iVar10 + -8;
                uVar13 = uVar15 >> ((byte)iVar10 & 0x3f);
                if (puVar1 < puVar7 + (uVar13 & 0xff)) {
                  return 0x17;
                }
                if (puVar7 + -1 < out) {
                  return 1;
                }
                if ((char)uVar13 != '\0') {
                  uVar2 = puVar7[-1];
                  do {
                    *puVar7 = uVar2;
                    puVar7 = puVar7 + 1;
                    bVar8 = (char)uVar13 - 1;
                    uVar13 = (ulong)bVar8;
                  } while (bVar8 != 0);
                }
              }
              else {
                if (puVar1 <= puVar7) {
                  return 0x17;
                }
                *puVar7 = (uint16_t)uVar4;
                puVar7 = puVar7 + 1;
              }
            }
            if ((uint)uVar9 == uVar16) {
              return 0x17;
            }
          }
          else {
            iVar10 = iVar12 - iVar11;
            if (iVar12 < iVar11) {
              return 0x17;
            }
            uVar3 = *(uint32_t *)((long)&hdecod->lit + uVar9);
            if (uVar3 == rlc) {
              if (iVar10 < 8) {
                if (pbVar14 <= in) {
                  return 1;
                }
                bVar8 = *in;
                in = in + 1;
                uVar15 = uVar15 << 8 | (ulong)bVar8;
                iVar10 = iVar10 + 8;
              }
              iVar10 = iVar10 + -8;
              uVar9 = uVar15 >> ((byte)iVar10 & 0x3f);
              if (puVar1 < puVar7 + (uVar9 & 0xff)) {
                return 0x17;
              }
              if (puVar7 + -1 < out) {
                return 1;
              }
              if ((char)uVar9 != '\0') {
                uVar2 = puVar7[-1];
                do {
                  *puVar7 = uVar2;
                  puVar7 = puVar7 + 1;
                  bVar8 = (char)uVar9 - 1;
                  uVar9 = (ulong)bVar8;
                } while (bVar8 != 0);
              }
            }
            else {
              if (puVar1 <= puVar7) {
                return 0x17;
              }
              *puVar7 = (uint16_t)uVar3;
              puVar7 = puVar7 + 1;
            }
          }
          iVar12 = iVar10;
        } while (0xd < iVar10);
      }
      iVar11 = iVar10;
    } while (in < pbVar14);
  }
  uVar16 = -(int)ni & 7;
  iVar11 = iVar10 - uVar16;
  if (iVar11 != 0 && (int)uVar16 <= iVar10) {
    uVar15 = uVar15 >> (sbyte)uVar16;
    do {
      uVar9 = (ulong)(((uint)(uVar15 << (0xeU - (char)iVar11 & 0x3f)) & 0x3fff) << 4);
      iVar10 = *(int *)((long)&hdecod->len + uVar9);
      if ((iVar10 == 0) || (iVar12 = iVar11 - iVar10, iVar11 < iVar10)) {
        return 0x17;
      }
      uVar3 = *(uint32_t *)((long)&hdecod->lit + uVar9);
      if (uVar3 == rlc) {
        if (iVar12 < 8) {
          if (pbVar14 <= in) {
            return 1;
          }
          bVar8 = *in;
          in = in + 1;
          uVar15 = uVar15 << 8 | (ulong)bVar8;
          iVar12 = iVar12 + 8;
        }
        iVar11 = iVar12 + -8;
        uVar9 = uVar15 >> ((byte)iVar11 & 0x3f);
        if (puVar1 < puVar7 + (uVar9 & 0xff)) {
          return 0x17;
        }
        if (puVar7 + -1 < out) {
          return 1;
        }
        if ((char)uVar9 != '\0') {
          uVar2 = puVar7[-1];
          do {
            *puVar7 = uVar2;
            puVar7 = puVar7 + 1;
            bVar8 = (char)uVar9 - 1;
            uVar9 = (ulong)bVar8;
          } while (bVar8 != 0);
        }
      }
      else {
        if (puVar1 <= puVar7) {
          return 0x17;
        }
        *puVar7 = (uint16_t)uVar3;
        puVar7 = puVar7 + 1;
        iVar11 = iVar12;
      }
    } while (0 < iVar11);
  }
  return (uint)(puVar7 != puVar1);
}

Assistant:

static exr_result_t
hufDecode (
    const uint64_t* hcode,  // i : encoding table
    const HufDec*   hdecod, // i : decoding table
    const uint8_t*  in,     // i : compressed input buffer
    uint64_t        ni,     // i : input size (in bits)
    uint32_t        rlc,    // i : run-length code
    uint64_t        no,     // i : expected output size (count of uint16 items)
    uint16_t*       out)
{
    uint64_t       i;
    uint64_t       c    = 0;
    int            lc   = 0;
    uint16_t*      outb = out;
    uint16_t*      oe   = out + no;
    const uint8_t* ie   = in + (ni + 7) / 8; // input byte size

    //
    // Loop on input bytes
    //

    while (in < ie)
    {
        getChar (c, lc, in);

        //
        // Access decoding table
        //

        while (lc >= HUF_DECBITS)
        {
            uint64_t      decoffset = (c >> (lc - HUF_DECBITS)) & HUF_DECMASK;
            const HufDec* pl        = hdecod + decoffset;

            if (pl->len)
            {
                //
                // Get short code
                //

                if (pl->len > lc) return EXR_ERR_CORRUPT_CHUNK;

                lc -= pl->len;
                getCode (pl->lit, rlc, c, lc, in, ie, out, outb, oe);
            }
            else
            {
                uint32_t        j;
                const uint32_t* decbuf = pl->p;
                if (!pl->p) return EXR_ERR_CORRUPT_CHUNK; // wrong code

                //
                // Search long code
                //

                for (j = 0; j < pl->lit; j++)
                {
                    int l = hufLength (hcode[decbuf[j]]);

                    while (lc < l && in < ie) // get more bits
                    {
                        getChar (c, lc, in);
                    }

                    if (lc >= l)
                    {
                        if (hufCode (hcode[decbuf[j]]) ==
                            ((c >> (lc - l)) & (((uint64_t) (1) << l) - 1)))
                        {
                            //
                            // Found : get long code
                            //

                            lc -= l;
                            getCode (
                                decbuf[j], rlc, c, lc, in, ie, out, outb, oe);
                            break;
                        }
                    }
                }

                if (j == pl->lit) return EXR_ERR_CORRUPT_CHUNK;
            }
        }
    }

    //
    // Get remaining (short) codes
    //

    i = (8 - ni) & 7;
    c >>= i;
    lc -= (int) i;

    while (lc > 0)
    {
        uint64_t      decoffset = (c << (HUF_DECBITS - lc)) & HUF_DECMASK;
        const HufDec* pl        = hdecod + decoffset;

        if (pl->len)
        {
            if (pl->len > lc) return EXR_ERR_CORRUPT_CHUNK;
            lc -= pl->len;
            getCode (pl->lit, rlc, c, lc, in, ie, out, outb, oe);
        }
        else
            return EXR_ERR_CORRUPT_CHUNK;
    }

    if (out != oe) return EXR_ERR_OUT_OF_MEMORY;
    return EXR_ERR_SUCCESS;
}